

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

bool __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8>::work_size
          (tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8> *this,int param_2,ggml_tensor *op,
          size_t *size)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong *in_RCX;
  long in_RDX;
  undefined1 local_1;
  
  if (*(int *)(in_RDX + 0x50) == 0x1b) {
    uVar1 = ggml_nelements(*(undefined8 *)(in_RDX + 0xa0));
    uVar2 = ggml_row_size(8,uVar1);
    *in_RCX = uVar2;
    local_1 = true;
  }
  else if (*(int *)(in_RDX + 0x50) == 0x1c) {
    uVar1 = ggml_nelements(*(undefined8 *)(in_RDX + 0xa0));
    uVar2 = ggml_row_size(8,uVar1);
    *in_RCX = uVar2;
    *in_RCX = *in_RCX + 7 & 0xfffffffffffffff8;
    *in_RCX = (*(long *)(*(long *)(in_RDX + 0x98) + 0x20) + 1) * 8 *
              *(long *)(*(long *)(in_RDX + 0xa0) + 0x20) + *in_RCX;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool work_size(int /* n_threads */, const struct ggml_tensor * op, size_t & size) override {
        // not realy a GGML_TYPE_Q8_0 but same size.
        switch (op->op) {
            case GGML_OP_MUL_MAT:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                return true;
            case GGML_OP_MUL_MAT_ID:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                size = GGML_PAD(size, sizeof(int64_t));  // + padding for next bloc.
                size += sizeof(int64_t) * (1+op->src[0]->ne[2]) * op->src[1]->ne[2];
                return true;
            default:
                // GGML_ABORT("fatal error");
                break;
        }
        return false;
    }